

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.h
# Opt level: O3

bool ViconCGStreamIO::VBufferDetail<0>::Read(VBufferImpl *i_rBufferImpl,string *o_rValue)

{
  uint uVar1;
  int iVar2;
  pointer puVar3;
  pointer puVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = i_rBufferImpl->m_Offset;
  puVar3 = (i_rBufferImpl->m_Buffer).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (i_rBufferImpl->m_Buffer).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)puVar3 - (long)puVar4;
  if ((ulong)uVar1 + 4 <= uVar6) {
    iVar2 = *(int *)(puVar4 + uVar1);
    i_rBufferImpl->m_Offset = uVar1 + 4;
    uVar5 = iVar2 + uVar1 + 4;
    if (uVar5 <= (uint)uVar6) {
      if (puVar4 == puVar3) {
        puVar4 = (pointer)0x0;
      }
      std::__cxx11::string::_M_replace
                ((ulong)o_rValue,0,(char *)o_rValue->_M_string_length,(ulong)(puVar4 + (uVar1 + 4)))
      ;
      i_rBufferImpl->m_Offset = uVar5;
      return true;
    }
  }
  return false;
}

Assistant:

static bool Read( const VBufferImpl & i_rBufferImpl, std::string & o_rValue )
  {
    ViconCGStreamType::UInt32 Size = 0;
    if( !i_rBufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    const unsigned int Offset = i_rBufferImpl.Offset();
    if( Offset + Size > i_rBufferImpl.Length() )
    {
      return false;
    }
    o_rValue.assign( reinterpret_cast< const char * >( i_rBufferImpl.Raw() + Offset ), Size );
    i_rBufferImpl.SetOffset( Offset + Size );
    return true;
  }